

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# movDemuxer.h
# Opt level: O1

int64_t __thiscall MovDemuxer::getTrackDelay(MovDemuxer *this,int32_t pid)

{
  _Rb_tree_header *p_Var1;
  mapped_type *pmVar2;
  mapped_type mVar3;
  _Base_ptr p_Var4;
  _Base_ptr p_Var5;
  key_type_conflict local_4;
  
  p_Var1 = &(this->m_firstTimecode)._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->m_firstTimecode)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var4 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < pid]) {
    if (pid <= (int)p_Var5[1]._M_color) {
      p_Var4 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var4 != p_Var1) && (p_Var5 = p_Var4, pid < (int)p_Var4[1]._M_color)) {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    mVar3 = 0;
  }
  else {
    pmVar2 = std::map<int,_long,_std::less<int>,_std::allocator<std::pair<const_int,_long>_>_>::
             operator[](&this->m_firstTimecode,&local_4);
    mVar3 = *pmVar2;
  }
  return mVar3;
}

Assistant:

int64_t getTrackDelay(const int32_t pid) override
    {
        return (m_firstTimecode.find(pid) != m_firstTimecode.end()) ? m_firstTimecode[pid] : 0;
    }